

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

longlong __thiscall mkvparser::Block::GetTime(Block *this,Cluster *pCluster)

{
  SegmentInfo *pSVar1;
  long lVar2;
  longlong lVar3;
  longlong lVar4;
  
  if (pCluster == (Cluster *)0x0) {
    __assert_fail("pCluster",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1f6d,"long long mkvparser::Block::GetTime(const Cluster *) const");
  }
  lVar3 = GetTimeCode(this,pCluster);
  pSVar1 = pCluster->m_pSegment->m_pInfo;
  if (pSVar1 != (SegmentInfo *)0x0) {
    lVar2 = pSVar1->m_timecodeScale;
    if (0 < lVar2) {
      if ((lVar3 == 0) ||
         (lVar4 = -1,
         lVar2 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar3),0))) {
        lVar4 = lVar2 * lVar3;
      }
      return lVar4;
    }
    __assert_fail("scale >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1f76,"long long mkvparser::Block::GetTime(const Cluster *) const");
  }
  __assert_fail("pInfo",
                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                ,0x1f73,"long long mkvparser::Block::GetTime(const Cluster *) const");
}

Assistant:

long long Block::GetTime(const Cluster* pCluster) const {
  assert(pCluster);

  const long long tc = GetTimeCode(pCluster);

  const Segment* const pSegment = pCluster->m_pSegment;
  const SegmentInfo* const pInfo = pSegment->GetInfo();
  assert(pInfo);

  const long long scale = pInfo->GetTimeCodeScale();
  assert(scale >= 1);

  // Check if tc * scale could overflow.
  if (tc != 0 && scale > LLONG_MAX / tc) {
    return -1;
  }
  const long long ns = tc * scale;

  return ns;
}